

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

value_type __thiscall djb::fresnel::schlick::zero_value(schlick *this)

{
  size_t __n;
  float *extraout_RDX;
  long in_RSI;
  value_type vVar1;
  float local_1c [3];
  schlick *this_local;
  
  local_1c[0] = 0.0;
  this_local = this;
  __n = std::valarray<float>::size((valarray<float> *)(in_RSI + 8));
  std::valarray<float>::valarray((valarray<float> *)this,local_1c,__n);
  vVar1._M_data = extraout_RDX;
  vVar1._M_size = (size_t)this;
  return vVar1;
}

Assistant:

const brdf::value_type zero_value() const {
			return brdf::value_type(float_t(0), f0.size());
		}